

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O1

void __thiscall
FlatMap<Point,double,PointCmp>::FlatMap<std::pair<Point,double>const*>
          (FlatMap<Point,double,PointCmp> *this,pair<Point,_double> *first,pair<Point,_double> *last
          ,PointCmp *comp)

{
  pair<Point,_double> *ppVar1;
  __normal_iterator<std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
  _Var2;
  long lVar3;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>,_std::pair<Point,_double>_>
  local_30;
  
  std::vector<std::pair<Point,double>,std::allocator<std::pair<Point,double>>>::
  vector<std::pair<Point,double>const*,void>
            ((vector<std::pair<Point,double>,std::allocator<std::pair<Point,double>>> *)this,first,
             last,(allocator_type *)&local_30);
  _Var2._M_current = *(pair<Point,_double> **)this;
  ppVar1 = *(pair<Point,_double> **)(this + 8);
  if (_Var2._M_current != ppVar1) {
    lVar3 = ((long)ppVar1 - (long)_Var2._M_current >> 3) * -0x5555555555555555;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>,_std::pair<Point,_double>_>
    ::_Temporary_buffer(&local_30,_Var2,(lVar3 - (lVar3 + 1 >> 0x3f)) + 1 >> 1);
    if (local_30._M_buffer == (pointer)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<Point,double>*,std::vector<std::pair<Point,double>,std::allocator<std::pair<Point,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<FlatMap<Point,double,PointCmp>::ValueToValueComparator>>
                (_Var2._M_current,ppVar1);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<Point,double>*,std::vector<std::pair<Point,double>,std::allocator<std::pair<Point,double>>>>,std::pair<Point,double>*,long,__gnu_cxx::__ops::_Iter_comp_iter<FlatMap<Point,double,PointCmp>::ValueToValueComparator>>
                (_Var2._M_current,ppVar1,local_30._M_buffer,local_30._M_len);
    }
    operator_delete(local_30._M_buffer);
  }
  _Var2 = std::
          __unique<__gnu_cxx::__normal_iterator<std::pair<Point,double>*,std::vector<std::pair<Point,double>,std::allocator<std::pair<Point,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<FlatMap<Point,double,PointCmp>::FlatMap<std::pair<Point,double>const*>(std::pair<Point,double>const*,std::pair<Point,double>const*,PointCmp_const&)::_lambda(std::pair<Point,double>const&,std::pair<Point,double>const&)_1_>>
                    (*(pair<Point,_double> **)this,*(pair<Point,_double> **)(this + 8),
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_tdepke2[P]CircuitSim2_src___FlatMap_h:45:62)>
                      )this);
  std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>::_M_erase
            ((vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_> *)this,
             (iterator)_Var2._M_current,*(pair<Point,_double> **)(this + 8));
  return;
}

Assistant:

FlatMap(InputIt first, InputIt last, const Compare& comp = Compare()) :
        vec_(first, last),
        comp_(comp),
        valueToKeyComp_(comp),
        valueToValueComp_(comp) {

        std::stable_sort(vec_.begin(), vec_.end(), valueToValueComp_);
        auto newLast = std::unique(vec_.begin(), vec_.end(), [this](const value_type& lhs, const value_type& rhs) {
            return !comp_(lhs.first, rhs.first);
        });
        vec_.erase(newLast, vec_.end());

        //mergeUnique(first, last);
    }